

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O2

void tinyformat::format<unsigned_long>(ostream *out,char *fmt,unsigned_long *args)

{
  FormatList local_28;
  FormatArg local_18;
  
  local_28.m_formatters = &local_18;
  local_28.m_N = 1;
  local_18.m_formatImpl = detail::FormatArg::formatImpl<unsigned_long>;
  local_18.m_toIntImpl = detail::FormatArg::toIntImpl<unsigned_long>;
  local_18.m_value = args;
  vformat(out,fmt,&local_28);
  return;
}

Assistant:

void format(std::ostream& out, const char* fmt, const Args&... args)
{
    vformat(out, fmt, makeFormatList(args...));
}